

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewExtension
          (ExtensionSet *this,int number,FieldDescriptor *descriptor,Extension **result)

{
  pointer ppVar1;
  __enable_if_t<is_constructible<value_type,_pair<int,_Extension>_>::value,_pair<iterator,_bool>_>
  _Var2;
  anon_union_8_21_eb924b1f_for_Extension_0 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  pair<int,_google::protobuf::internal::ExtensionSet::Extension> local_58;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  insert_result;
  Extension **result_local;
  FieldDescriptor *descriptor_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  local_78.int64_value = 0;
  uStack_70 = 0;
  local_68 = 0;
  insert_result._8_8_ = result;
  descriptor_local._4_4_ = number;
  pEStack_10 = this;
  std::make_pair<int&,google::protobuf::internal::ExtensionSet::Extension>
            (&local_58,(int *)((long)&descriptor_local + 4),(Extension *)&local_78);
  _Var2 = std::
          map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::insert<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,&local_58);
  local_38 = _Var2.first._M_node;
  insert_result.first._M_node._0_1_ = _Var2.second;
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_38);
  *(Extension **)insert_result._8_8_ = &ppVar1->second;
  *(FieldDescriptor **)(*(long *)insert_result._8_8_ + 0x10) = descriptor;
  return (bool)((byte)insert_result.first._M_node & 1);
}

Assistant:

bool ExtensionSet::MaybeNewExtension(int number,
                                     const FieldDescriptor* descriptor,
                                     Extension** result) {
  std::pair<ExtensionMap::iterator, bool> insert_result =
      extensions_.insert(std::make_pair(number, Extension()));
  *result = &insert_result.first->second;
  (*result)->descriptor = descriptor;
  return insert_result.second;
}